

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlNodeAddContent(xmlNodePtr cur,xmlChar *content)

{
  int len_00;
  int len;
  xmlChar *content_local;
  xmlNodePtr cur_local;
  
  if ((cur != (xmlNodePtr)0x0) && (content != (xmlChar *)0x0)) {
    len_00 = xmlStrlen(content);
    xmlNodeAddContentLen(cur,content,len_00);
  }
  return;
}

Assistant:

void
xmlNodeAddContent(xmlNodePtr cur, const xmlChar *content) {
    int len;

    if (cur == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNodeAddContent : node == NULL\n");
#endif
	return;
    }
    if (content == NULL) return;
    len = xmlStrlen(content);
    xmlNodeAddContentLen(cur, content, len);
}